

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

STRING_HANDLE STRING_clone(STRING_HANDLE handle)

{
  char *__s;
  STRING_HANDLE __ptr;
  size_t sVar1;
  char *__dest;
  LOGGER_LOG p_Var2;
  size_t __size;
  
  if ((handle != (STRING_HANDLE)0x0) &&
     (__ptr = (STRING_HANDLE)malloc(8), __ptr != (STRING_HANDLE)0x0)) {
    __s = handle->s;
    sVar1 = strlen(__s);
    __size = 0xffffffffffffffff;
    if (sVar1 + 1 != 0) {
      __size = sVar1 + 1;
    }
    if (__size != 0xffffffffffffffff) {
      __dest = (char *)malloc(__size);
      __ptr->s = __dest;
      if (__dest != (char *)0x0) {
        memcpy(__dest,__s,__size);
        return __ptr;
      }
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/strings.c"
                ,"STRING_clone",0x42,1,"Failure allocating clone value. size=%zu",__size);
    }
    free(__ptr);
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE STRING_clone(STRING_HANDLE handle)
{
    STRING* result;
    /*Codes_SRS_STRING_02_002: [If parameter handle is NULL then STRING_clone shall return NULL.]*/
    if (handle == NULL)
    {
        result = NULL;
    }
    else
    {
        /*Codes_SRS_STRING_02_003: [If STRING_clone fails for any reason, it shall return NULL.] */
        if ((result = (STRING*)malloc(sizeof(STRING))) != NULL)
        {
            STRING* source = (STRING*)handle;
            /*Codes_SRS_STRING_02_003: [If STRING_clone fails for any reason, it shall return NULL.] */
            size_t sourceLen = safe_add_size_t(strlen(source->s), 1);

            if (sourceLen == SIZE_MAX ||
                (result->s = (char*)malloc(sourceLen)) == NULL)
            {
                LogError("Failure allocating clone value. size=%zu", sourceLen);
                free(result);
                result = NULL;
            }
            else
            {
                (void)memcpy(result->s, source->s, sourceLen);
            }
        }
        else
        {
            /*not much to do, result is NULL from malloc*/
        }
    }
    return (STRING_HANDLE)result;
}